

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

void getAvailableFeatures(uint ECX,uint EDX,uint MaxLeaf,uint *FeaturesOut,uint *Features2Out)

{
  bool bVar1;
  byte local_49;
  byte local_48;
  bool local_47;
  bool local_46;
  uint local_44;
  byte local_3f;
  bool local_3e;
  bool HasExtLeaf1;
  uint MaxExtLevel;
  bool HasLeaf7;
  bool HasAVX512Save;
  uint uStack_38;
  bool HasAVX;
  uint AVXBits;
  uint EBX;
  uint EAX;
  uint Features2;
  uint Features;
  uint *Features2Out_local;
  uint *FeaturesOut_local;
  uint local_10;
  uint MaxLeaf_local;
  uint EDX_local;
  uint ECX_local;
  
  AVXBits = 0;
  uStack_38 = 0;
  EAX = (uint)((EDX >> 0xf & 1) != 0);
  if ((EDX >> 0x17 & 1) != 0) {
    EAX = EAX | 2;
  }
  if ((EDX >> 0x19 & 1) != 0) {
    EAX = EAX | 8;
  }
  if ((EDX >> 0x1a & 1) != 0) {
    EAX = EAX | 0x10;
  }
  if ((ECX & 1) != 0) {
    EAX = EAX | 0x20;
  }
  if ((ECX >> 1 & 1) != 0) {
    EAX = EAX | 0x80000;
  }
  if ((ECX >> 9 & 1) != 0) {
    EAX = EAX | 0x40;
  }
  if ((ECX >> 0xc & 1) != 0) {
    EAX = EAX | 0x4000;
  }
  if ((ECX >> 0x13 & 1) != 0) {
    EAX = EAX | 0x80;
  }
  if ((ECX >> 0x14 & 1) != 0) {
    EAX = EAX | 0x100;
  }
  if ((ECX >> 0x17 & 1) != 0) {
    EAX = EAX | 4;
  }
  if ((ECX >> 0x19 & 1) != 0) {
    EAX = EAX | 0x40000;
  }
  EBX = (uint)((ECX >> 0x16 & 1) != 0);
  MaxExtLevel = 0x18000000;
  local_46 = false;
  _Features2 = Features2Out;
  Features2Out_local = FeaturesOut;
  FeaturesOut_local._4_4_ = MaxLeaf;
  local_10 = EDX;
  MaxLeaf_local = ECX;
  if ((ECX & 0x18000000) == 0x18000000) {
    bVar1 = getX86XCR0(&AVXBits,&local_10);
    local_46 = false;
    if (!bVar1) {
      local_46 = (AVXBits & 6) == 6;
    }
  }
  HasExtLeaf1 = local_46;
  local_47 = local_46 != false && (AVXBits & 0xe0) == 0xe0;
  local_3e = local_47;
  if (local_46 != false) {
    EAX = EAX | 0x200;
  }
  local_48 = 0;
  if (6 < FeaturesOut_local._4_4_) {
    bVar1 = getX86CpuIDAndInfoEx(7,0,&AVXBits,&stack0xffffffffffffffc8,&MaxLeaf_local,&local_10);
    local_48 = bVar1 ^ 0xff;
  }
  local_3f = local_48 & 1;
  if ((local_3f != 0) && ((uStack_38 >> 3 & 1) != 0)) {
    EAX = EAX | 0x10000;
  }
  if (((local_3f != 0) && ((uStack_38 >> 5 & 1) != 0)) && ((HasExtLeaf1 & 1U) != 0)) {
    EAX = EAX | 0x400;
  }
  if ((local_3f != 0) && ((uStack_38 >> 9 & 1) != 0)) {
    EAX = EAX | 0x20000;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x10 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x8000;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x11 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x400000;
  }
  if ((local_3f != 0) && ((uStack_38 >> 0x13 & 1) != 0)) {
    EBX = EBX | 2;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x15 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x8000000;
  }
  if ((local_3f != 0) && ((uStack_38 >> 0x17 & 1) != 0)) {
    EBX = EBX | 8;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x1a & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x2000000;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x1b & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x1000000;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x1c & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x800000;
  }
  if ((local_3f != 0) && ((uStack_38 >> 0x1d & 1) != 0)) {
    EBX = EBX | 0x10;
  }
  if (((local_3f != 0) && ((uStack_38 >> 0x1e & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x200000;
  }
  if (((local_3f != 0) && ((int)uStack_38 < 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x100000;
  }
  if (((local_3f != 0) && ((MaxLeaf_local >> 1 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x4000000;
  }
  if (((local_3f != 0) && ((MaxLeaf_local >> 0xe & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x40000000;
  }
  if (((local_3f != 0) && ((local_10 >> 2 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x10000000;
  }
  if (((local_3f != 0) && ((local_10 >> 3 & 1) != 0)) && ((local_3e & 1U) != 0)) {
    EAX = EAX | 0x20000000;
  }
  getX86CpuIDAndInfo(0x80000000,&local_44,&stack0xffffffffffffffc8,&MaxLeaf_local,&local_10);
  local_49 = 0;
  if (0x80000000 < local_44) {
    bVar1 = getX86CpuIDAndInfo(0x80000001,&AVXBits,&stack0xffffffffffffffc8,&MaxLeaf_local,&local_10
                              );
    local_49 = bVar1 ^ 0xff;
  }
  local_49 = local_49 & 1;
  if ((local_49 != 0) && ((MaxLeaf_local >> 6 & 1) != 0)) {
    EAX = EAX | 0x800;
  }
  if ((local_49 != 0) && ((MaxLeaf_local >> 0xb & 1) != 0)) {
    EAX = EAX | 0x2000;
  }
  if ((local_49 != 0) && ((MaxLeaf_local >> 0x10 & 1) != 0)) {
    EAX = EAX | 0x1000;
  }
  if ((local_49 != 0) && ((local_10 >> 0x1d & 1) != 0)) {
    EBX = EBX | 4;
  }
  *Features2Out_local = EAX;
  *_Features2 = EBX;
  return;
}

Assistant:

static void getAvailableFeatures(unsigned ECX, unsigned EDX, unsigned MaxLeaf,
                                 unsigned *FeaturesOut,
                                 unsigned *Features2Out) {
  unsigned Features = 0;
  unsigned Features2 = 0;
  unsigned EAX = 0, EBX = 0;

  if ((EDX >> 15) & 1)
    Features |= 1 << X86::FEATURE_CMOV;
  if ((EDX >> 23) & 1)
    Features |= 1 << X86::FEATURE_MMX;
  if ((EDX >> 25) & 1)
    Features |= 1 << X86::FEATURE_SSE;
  if ((EDX >> 26) & 1)
    Features |= 1 << X86::FEATURE_SSE2;

  if ((ECX >> 0) & 1)
    Features |= 1 << X86::FEATURE_SSE3;
  if ((ECX >> 1) & 1)
    Features |= 1 << X86::FEATURE_PCLMUL;
  if ((ECX >> 9) & 1)
    Features |= 1 << X86::FEATURE_SSSE3;
  if ((ECX >> 12) & 1)
    Features |= 1 << X86::FEATURE_FMA;
  if ((ECX >> 19) & 1)
    Features |= 1 << X86::FEATURE_SSE4_1;
  if ((ECX >> 20) & 1)
    Features |= 1 << X86::FEATURE_SSE4_2;
  if ((ECX >> 23) & 1)
    Features |= 1 << X86::FEATURE_POPCNT;
  if ((ECX >> 25) & 1)
    Features |= 1 << X86::FEATURE_AES;

  if ((ECX >> 22) & 1)
    Features2 |= 1 << (X86::FEATURE_MOVBE - 32);

  // If CPUID indicates support for XSAVE, XRESTORE and AVX, and XGETBV
  // indicates that the AVX registers will be saved and restored on context
  // switch, then we have full AVX support.
  const unsigned AVXBits = (1 << 27) | (1 << 28);
  bool HasAVX = ((ECX & AVXBits) == AVXBits) && !getX86XCR0(&EAX, &EDX) &&
                ((EAX & 0x6) == 0x6);
  bool HasAVX512Save = HasAVX && ((EAX & 0xe0) == 0xe0);

  if (HasAVX)
    Features |= 1 << X86::FEATURE_AVX;

  bool HasLeaf7 =
      MaxLeaf >= 0x7 && !getX86CpuIDAndInfoEx(0x7, 0x0, &EAX, &EBX, &ECX, &EDX);

  if (HasLeaf7 && ((EBX >> 3) & 1))
    Features |= 1 << X86::FEATURE_BMI;
  if (HasLeaf7 && ((EBX >> 5) & 1) && HasAVX)
    Features |= 1 << X86::FEATURE_AVX2;
  if (HasLeaf7 && ((EBX >> 9) & 1))
    Features |= 1 << X86::FEATURE_BMI2;
  if (HasLeaf7 && ((EBX >> 16) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512F;
  if (HasLeaf7 && ((EBX >> 17) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512DQ;
  if (HasLeaf7 && ((EBX >> 19) & 1))
    Features2 |= 1 << (X86::FEATURE_ADX - 32);
  if (HasLeaf7 && ((EBX >> 21) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512IFMA;
  if (HasLeaf7 && ((EBX >> 23) & 1))
    Features2 |= 1 << (X86::FEATURE_CLFLUSHOPT - 32);
  if (HasLeaf7 && ((EBX >> 26) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512PF;
  if (HasLeaf7 && ((EBX >> 27) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512ER;
  if (HasLeaf7 && ((EBX >> 28) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512CD;
  if (HasLeaf7 && ((EBX >> 29) & 1))
    Features2 |= 1 << (X86::FEATURE_SHA - 32);
  if (HasLeaf7 && ((EBX >> 30) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512BW;
  if (HasLeaf7 && ((EBX >> 31) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512VL;

  if (HasLeaf7 && ((ECX >> 1) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512VBMI;
  if (HasLeaf7 && ((ECX >> 14) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX512VPOPCNTDQ;

  if (HasLeaf7 && ((EDX >> 2) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX5124VNNIW;
  if (HasLeaf7 && ((EDX >> 3) & 1) && HasAVX512Save)
    Features |= 1 << X86::FEATURE_AVX5124FMAPS;

  unsigned MaxExtLevel;
  getX86CpuIDAndInfo(0x80000000, &MaxExtLevel, &EBX, &ECX, &EDX);

  bool HasExtLeaf1 = MaxExtLevel >= 0x80000001 &&
                     !getX86CpuIDAndInfo(0x80000001, &EAX, &EBX, &ECX, &EDX);
  if (HasExtLeaf1 && ((ECX >> 6) & 1))
    Features |= 1 << X86::FEATURE_SSE4_A;
  if (HasExtLeaf1 && ((ECX >> 11) & 1))
    Features |= 1 << X86::FEATURE_XOP;
  if (HasExtLeaf1 && ((ECX >> 16) & 1))
    Features |= 1 << X86::FEATURE_FMA4;

  if (HasExtLeaf1 && ((EDX >> 29) & 1))
    Features2 |= 1 << (X86::FEATURE_EM64T - 32);

  *FeaturesOut  = Features;
  *Features2Out = Features2;
}